

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArrayEqualFailsOnNotEqual::~TestCheckArrayEqualFailsOnNotEqual
          (TestCheckArrayEqualFailsOnNotEqual *this)

{
  TestCheckArrayEqualFailsOnNotEqual *this_local;
  
  ~TestCheckArrayEqualFailsOnNotEqual(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckArrayEqualFailsOnNotEqual)
{
    bool failure = false;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		int const data1[4] = { 0, 1, 2, 3 };
        int const data2[4] = { 0, 1, 3, 3 };
        CHECK_ARRAY_EQUAL (data1, data2, 4);

		failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(failure);
}